

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FAudio_internal.c
# Opt level: O1

void FAudio_INTERNAL_DecodePCM8
               (FAudioVoice *voice,FAudioBuffer *buffer,float *decodeCache,uint32_t samples)

{
  uint uVar1;
  
  uVar1 = (uint)((voice->field_19).src.format)->nChannels;
  (*FAudio_INTERNAL_Convert_U8_To_F32)
            (buffer->pAudioData + (voice->field_19).src.curBufferOffset * uVar1,decodeCache,
             uVar1 * samples);
  return;
}

Assistant:

void FAudio_INTERNAL_DecodePCM8(
	FAudioVoice *voice,
	FAudioBuffer *buffer,
	float *decodeCache,
	uint32_t samples
) {
	LOG_FUNC_ENTER(voice->audio)
	FAudio_INTERNAL_Convert_U8_To_F32(
		((uint8_t*) buffer->pAudioData) + (
			voice->src.curBufferOffset * voice->src.format->nChannels
		),
		decodeCache,
		samples * voice->src.format->nChannels
	);
	LOG_FUNC_EXIT(voice->audio)
}